

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_encode_ext_safe(char *data,ptrdiff_t *data_sz,int8_t type,char *str,uint32_t len)

{
  uint32_t uVar1;
  char *pcVar2;
  uint32_t len_local;
  char *str_local;
  int8_t type_local;
  ptrdiff_t *data_sz_local;
  char *data_local;
  
  if (data_sz != (ptrdiff_t *)0x0) {
    uVar1 = mp_sizeof_ext(len);
    *data_sz = *data_sz - (ulong)uVar1;
    if (*data_sz < 0) {
      return data;
    }
  }
  pcVar2 = mp_encode_ext(data,type,str,len);
  return pcVar2;
}

Assistant:

MP_IMPL char *
mp_encode_ext_safe(char *data, ptrdiff_t *data_sz,
		   int8_t type, const char *str, uint32_t len)
{
	if (data_sz != NULL) {
		*data_sz -= mp_sizeof_ext(len);
		if (*data_sz < 0)
			return data;
	}
	return mp_encode_ext(data, type, str, len);
}